

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

int __thiscall
Player::executeFortify(Player *this,Country *fromCountry,Country *countryToFortify,int numArmies)

{
  Country *this_00;
  int iVar1;
  ostream *poVar2;
  string local_78;
  string local_48;
  int local_24;
  Country *pCStack_20;
  int numArmies_local;
  Country *countryToFortify_local;
  Country *fromCountry_local;
  Player *this_local;
  
  local_24 = numArmies;
  pCStack_20 = countryToFortify;
  countryToFortify_local = fromCountry;
  fromCountry_local = (Country *)this;
  iVar1 = Map::Country::getNumberOfTroops(fromCountry);
  Map::Country::setNumberOfTroops(fromCountry,iVar1 - local_24);
  this_00 = pCStack_20;
  iVar1 = Map::Country::getNumberOfTroops(pCStack_20);
  Map::Country::setNumberOfTroops(this_00,iVar1 + local_24);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nPlayer ");
  iVar1 = getPlayerId(this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2," has fortified ");
  Map::Country::getCountryName_abi_cxx11_(&local_48,pCStack_20);
  poVar2 = std::operator<<(poVar2,(string *)&local_48);
  poVar2 = std::operator<<(poVar2," from ");
  Map::Country::getCountryName_abi_cxx11_(&local_78,countryToFortify_local);
  poVar2 = std::operator<<(poVar2,(string *)&local_78);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_48);
  (*this->strategy->_vptr_PlayerStrategy[5])();
  return 1;
}

Assistant:

int Player::executeFortify(Map::Country &fromCountry, Map::Country &countryToFortify, int numArmies) {
    /*
     * Act of moving armies between this player's owned countries.
     * fromCountry and countryToFortify have to be owned by this player and adjacent to each other.
     */

    fromCountry.setNumberOfTroops(fromCountry.getNumberOfTroops() - numArmies);
    countryToFortify.setNumberOfTroops(countryToFortify.getNumberOfTroops() + numArmies);
    std::cout << "\nPlayer " << this->getPlayerId() << " has fortified " << countryToFortify.getCountryName()
              << " from "
              << fromCountry.getCountryName() << std::endl;
    this->strategy->resetChoices();
    return PlayerAction::SUCCEEDED;
}